

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O0

string * testing::internal::GetTypeName_abi_cxx11_(type_info *type)

{
  type_info *in_RSI;
  string *in_RDI;
  string name_str;
  char *readable_name;
  int status;
  char *name;
  string local_80 [16];
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_49;
  string local_48 [32];
  void *local_28;
  int local_1c;
  char *local_18;
  
  local_18 = std::type_info::name(in_RSI);
  local_1c = 0;
  local_28 = (void *)__cxa_demangle(local_18,0,0,&local_1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::allocator<char>::~allocator(&local_49);
  free(local_28);
  std::__cxx11::string::string(local_80,local_48);
  CanonicalizeForStdLibVersioning(in_RDI);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

inline std::string GetTypeName(const std::type_info& type) {
  const char* const name = type.name();
#if GTEST_HAS_CXXABI_H_ || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#if GTEST_HAS_CXXABI_H_
  using abi::__cxa_demangle;
#endif  // GTEST_HAS_CXXABI_H_
  char* const readable_name = __cxa_demangle(name, nullptr, nullptr, &status);
  const std::string name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return CanonicalizeForStdLibVersioning(name_str);
#else
  return name;
#endif  // GTEST_HAS_CXXABI_H_ || __HP_aCC
}